

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

bool __thiscall ccs::ParserImpl::parseRuleset(ParserImpl *this,Nested *ast)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Alloc_hider local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  advance(this);
  if ((this->cur_).type == CONTEXT) {
    advance(this);
    parseContext((ParserImpl *)&stack0xffffffffffffffd8);
    p_Var2 = p_Stack_20;
    _Var1._M_p = local_28._M_p;
    local_28._M_p = (pointer)0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (ast->selector_).
              super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (ast->selector_).super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)_Var1._M_p;
    (ast->selector_).super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
    }
  }
  while ((this->cur_).type != EOS) {
    parseRule(this,ast);
  }
  return true;
}

Assistant:

bool parseRuleset(ast::Nested &ast) {
    advance();
    if (advanceIf(Token::CONTEXT)) ast.selector_ = parseContext();
    while (cur_.type != Token::EOS) parseRule(ast);
    return true;
  }